

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::CalculateHash
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this)

{
  size_t in_RAX;
  size_t sVar1;
  PipelineResourceAttribsType *this_00;
  Uint32 i;
  uint ResIndex;
  size_t local_28;
  
  local_28 = in_RAX;
  sVar1 = CalculatePipelineResourceSignatureDescHash
                    (&(this->
                      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      ).m_Desc);
  this->m_Hash = sVar1;
  for (ResIndex = 0;
      ResIndex <
      (this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources; ResIndex = ResIndex + 1) {
    this_00 = GetResourceAttribs(this,ResIndex);
    local_28 = PipelineResourceAttribsVk::GetHash(this_00);
    HashCombine<unsigned_long>(&this->m_Hash,&local_28);
  }
  return;
}

Assistant:

void CalculateHash()
    {
        const PipelineResourceSignatureImplType* const pThisImpl = static_cast<const PipelineResourceSignatureImplType*>(this);

        m_Hash = CalculatePipelineResourceSignatureDescHash(this->m_Desc);
        for (Uint32 i = 0; i < this->m_Desc.NumResources; ++i)
        {
            const PipelineResourceAttribsType& Attr = pThisImpl->GetResourceAttribs(i);
            HashCombine(m_Hash, Attr.GetHash());
        }
    }